

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O3

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextDataLine
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer,
          char continuationToken)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  ulong uVar4;
  undefined4 extraout_var_00;
  byte bVar5;
  long lVar6;
  bool bVar7;
  
  std::vector<char,_std::allocator<char>_>::resize(buffer,this->m_cacheSize);
  uVar4 = this->m_cachePos;
  if (this->m_filePos == 0 || this->m_cacheSize <= uVar4) {
    (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
    iVar2 = (*this->m_stream->_vptr_IOStream[2])
                      (this->m_stream,
                       (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,1,this->m_cacheSize);
    uVar4 = CONCAT44(extraout_var,iVar2);
    if (uVar4 == 0) {
      return false;
    }
    uVar3 = this->m_cacheSize;
    if (uVar4 < this->m_cacheSize) {
      this->m_cacheSize = uVar4;
      uVar3 = uVar4;
    }
    this->m_filePos = this->m_filePos + uVar3;
    this->m_cachePos = 0;
    this->m_blockIdx = this->m_blockIdx + 1;
    uVar4 = 0;
  }
  bVar7 = false;
  lVar6 = 0;
  do {
    pcVar1 = (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar5 = pcVar1[uVar4];
    uVar3 = uVar4;
    if (bVar5 == continuationToken) {
      uVar3 = uVar4 + 1;
      this->m_cachePos = uVar3;
      bVar5 = pcVar1[uVar4 + 1];
      bVar7 = true;
    }
    if ((bVar5 < 0xe) && ((0x3401U >> (bVar5 & 0x1f) & 1) != 0)) {
      if (!bVar7) {
LAB_00450d3b:
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar6] = '\n';
        this->m_cachePos = this->m_cachePos + 1;
        return true;
      }
      while (bVar5 != 10) {
        this->m_cachePos = uVar3 + 1;
        bVar5 = pcVar1[uVar3 + 1];
        uVar3 = uVar3 + 1;
      }
      this->m_cachePos = uVar3 + 1;
      bVar5 = pcVar1[uVar3 + 1];
      bVar7 = false;
    }
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar6] = bVar5;
    uVar4 = this->m_cachePos + 1;
    this->m_cachePos = uVar4;
    lVar6 = lVar6 + 1;
    if (this->m_filesize <= uVar4) goto LAB_00450d3b;
    if (this->m_cacheSize <= uVar4) {
      (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
      iVar2 = (*this->m_stream->_vptr_IOStream[2])
                        (this->m_stream,
                         (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,1,this->m_cacheSize);
      uVar4 = CONCAT44(extraout_var_00,iVar2);
      if (uVar4 == 0) {
        return false;
      }
      uVar3 = this->m_cacheSize;
      if (uVar4 < this->m_cacheSize) {
        this->m_cacheSize = uVar4;
        uVar3 = uVar4;
      }
      this->m_filePos = this->m_filePos + uVar3;
      this->m_cachePos = 0;
      this->m_blockIdx = this->m_blockIdx + 1;
      uVar4 = 0;
    }
  } while( true );
}

Assistant:

inline
bool IOStreamBuffer<T>::getNextDataLine( std::vector<T> &buffer, T continuationToken ) {
    buffer.resize( m_cacheSize );
    if ( m_cachePos >= m_cacheSize || 0 == m_filePos ) {
        if ( !readNextBlock() ) {
            return false;
        }
    }

    bool continuationFound( false );
    size_t i = 0;
    for( ;; ) {
        if ( continuationToken == m_cache[ m_cachePos ] ) {
            continuationFound = true;
            ++m_cachePos;
        }
        if ( IsLineEnd( m_cache[ m_cachePos ] ) ) {
            if ( !continuationFound ) {
                // the end of the data line
                break;
            } else {
                // skip line end
                while ( m_cache[m_cachePos] != '\n') {
                    ++m_cachePos;
                }
                ++m_cachePos;
                continuationFound = false;
            }
        }

        buffer[ i ] = m_cache[ m_cachePos ];
        ++m_cachePos;
        ++i;
        if (m_cachePos >= size()) {
            break;
        }
        if ( m_cachePos >= m_cacheSize ) {
            if ( !readNextBlock() ) {
                return false;
            }
        }
    }
    
    buffer[ i ] = '\n';
    ++m_cachePos;

    return true;
}